

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw1_subh0_w32_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m256i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint in_ECX;
  long in_RDX;
  void *in_RSI;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  long in_stack_00000008;
  __m256i m0;
  __m256i m1_ac;
  __m256i m0_ac;
  __m256i m_i01;
  __m256i m_i00;
  int j;
  int i;
  __m256i zeros;
  __m256i one_b;
  __m256i v_maxval;
  undefined4 in_stack_fffffffffffffc6c;
  int in_stack_fffffffffffffc70;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined8 uStack_298;
  undefined8 local_218;
  CONV_BUF_TYPE *in_stack_fffffffffffffe20;
  CONV_BUF_TYPE *in_stack_fffffffffffffe28;
  uint8_t *in_stack_fffffffffffffe30;
  undefined8 uStack_130;
  undefined8 uStack_128;
  
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  vpinsrw_avx(auVar2,0x40,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  vpinsrw_avx(auVar2,0x40,7);
  auVar2 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,1,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,1,5);
  auVar2 = vpinsrb_avx(auVar2,1,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,1,9);
  auVar2 = vpinsrb_avx(auVar2,1,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,1,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,1,0xe);
  auVar2 = vpinsrb_avx(auVar2,1,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auVar1 = vpinsrb_avx(auVar1,1,0xf);
  uStack_130 = auVar1._0_8_;
  uStack_128 = auVar1._8_8_;
  auVar5 = ZEXT832(0) << 0x20;
  auVar8 = ZEXT3264(auVar5);
  local_218 = in_RDX;
  for (local_2a4 = 0; local_2a4 < (int)mask_stride; local_2a4 = local_2a4 + 1) {
    for (local_2a8 = 0; auVar6 = auVar8._0_32_, local_2a8 < h; local_2a8 = local_2a8 + 0x20) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + (local_2a8 << 1)),in_RSI);
      auVar7 = auVar6;
      yy_loadu_256((__m256i *)(in_stack_00000008 + (local_2a8 << 1) + 0x20),in_RSI);
      auVar4._16_8_ = uStack_130;
      auVar4._0_16_ = auVar2;
      auVar4._24_8_ = uStack_128;
      auVar6 = vpmaddubsw_avx2(auVar6,auVar4);
      auVar3._16_8_ = uStack_130;
      auVar3._0_16_ = auVar2;
      auVar3._24_8_ = uStack_128;
      auVar3 = vpmaddubsw_avx2(auVar7,auVar3);
      uStack_298 = SUB328(ZEXT832(0),4);
      vpavgw_avx2(auVar6,ZEXT832(uStack_298) << 0x40);
      auVar6 = vpavgw_avx2(auVar3,ZEXT832(uStack_298) << 0x40);
      in_RSI = (void *)(local_218 + (long)local_2a8 * 2);
      auVar8 = ZEXT1664(auVar6._0_16_);
      blend_a64_d16_mask_w32_avx2
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 auVar5._24_8_,auVar5._16_8_,auVar5._8_8_,
                 (__m256i *)CONCAT44(in_stack_fffffffffffffc6c,round_offset._0_4_),
                 in_stack_fffffffffffffc70);
    }
    in_stack_00000008 = in_stack_00000008 + ((ulong)mask & 0xffffffff);
    local_218 = local_218 + (ulong)in_ECX * 2;
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw1_subh0_w32_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m256i *round_offset, int shift) {
  const __m256i v_maxval = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m256i one_b = _mm256_set1_epi8(1);
  const __m256i zeros = _mm256_setzero_si256();
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 32) {
      const __m256i m_i00 = yy_loadu_256(mask + 2 * j);
      const __m256i m_i01 = yy_loadu_256(mask + 2 * j + 32);
      const __m256i m0_ac = _mm256_maddubs_epi16(m_i00, one_b);
      const __m256i m1_ac = _mm256_maddubs_epi16(m_i01, one_b);
      const __m256i m0 = _mm256_avg_epu16(m0_ac, zeros);
      const __m256i m1 = _mm256_avg_epu16(m1_ac, zeros);

      blend_a64_d16_mask_w32_avx2(dst + j, src0 + j, src1 + j, &m0, &m1,
                                  round_offset, &v_maxval, shift);
    }
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}